

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O2

int findpara(void)

{
  bool bVar1;
  buffer *pbVar2;
  mgwin *pmVar3;
  ushort **ppuVar4;
  ulong uVar5;
  ulong uVar6;
  line *plVar7;
  
  pmVar3 = curwp;
  pbVar2 = curbp;
  plVar7 = curwp->w_dotp;
  while( true ) {
    pmVar3->w_doto = 0;
    uVar5 = 0;
    uVar6 = (ulong)(uint)plVar7->l_used;
    if (plVar7->l_used < 1) {
      uVar6 = uVar5;
    }
    bVar1 = false;
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (ulong)(byte)plVar7->l_text[uVar5] * 2 + 1) & 0x20) == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) break;
    plVar7 = plVar7->l_fp;
    if (plVar7 == pbVar2->b_headp) {
      return 0;
    }
    pmVar3->w_dotp = plVar7;
    pmVar3->w_dotline = pmVar3->w_dotline + 1;
  }
  return 1;
}

Assistant:

int
findpara(void)
{
	int	col, nospace = 0;

	/* we move forward to find a para to mark */
	do {
		curwp->w_doto = 0;
		col = 0;

		/* check if we are on a blank line */
		while (col < llength(curwp->w_dotp)) {
			if (!isspace(lgetc(curwp->w_dotp, col)))
				nospace = 1;
			col++;
		}
		if (nospace)
			break;

		if (lforw(curwp->w_dotp) == curbp->b_headp)
			return (FALSE);

		curwp->w_dotp = lforw(curwp->w_dotp);	
		curwp->w_dotline++;
	} while (1);

	return (TRUE);
}